

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseConst.cpp
# Opt level: O2

void __thiscall
glslang::TConstTraverser::TConstTraverser
          (TConstTraverser *this,TConstUnionArray *cUnion,bool singleConstParam,
          TOperator constructType,TType *t)

{
  TIntermTraverser::TIntermTraverser(&this->super_TIntermTraverser,true,false,false,false);
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__TConstTraverser_00a64a50;
  (this->unionArray)._vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_00a5b8a8;
  (this->unionArray).unionArray = cUnion->unionArray;
  this->type = t;
  this->constructorType = constructType;
  this->singleConstantParam = singleConstParam;
  this->error = false;
  this->isMatrix = false;
  this->matrixCols = 0;
  this->matrixRows = 0;
  this->index = 0;
  this->tOp = EOpNull;
  return;
}

Assistant:

TConstTraverser(const TConstUnionArray& cUnion, bool singleConstParam, TOperator constructType, const TType& t)
      : unionArray(cUnion), type(t),
        constructorType(constructType), singleConstantParam(singleConstParam), error(false), isMatrix(false),
        matrixCols(0), matrixRows(0) {  index = 0; tOp = EOpNull; }